

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallDirectoryGenerator::GenerateScriptForConfig
          (cmInstallDirectoryGenerator *this,ostream *os,string *config,Indent indent)

{
  pointer pbVar1;
  cmMakefile *this_00;
  pointer pbVar2;
  bool bVar3;
  string *psVar4;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  cmGeneratorExpression ge;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  cmListFileBacktrace local_68;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_68.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmGeneratorExpression::cmGeneratorExpression(&ge,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pbVar1 = (this->Directories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (this->Directories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = dirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
    local_88._M_allocated_capacity = (size_type)&local_78;
    local_88._8_8_ = 0;
    local_78._M_local_buf[0] = '\0';
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        cge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)&local_88);
    cmSystemTools::ExpandListArgument(psVar4,&dirs,false);
    std::__cxx11::string::~string((string *)local_88._M_local_buf);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
  }
  this_00 = this->LocalGenerator->Makefile;
  for (pbVar5 = dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1) {
    bVar3 = cmsys::SystemTools::FileIsFullPath(pbVar5);
    if (!bVar3) {
      psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cge,
                     psVar4,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cge,
                     pbVar5);
      std::__cxx11::string::operator=((string *)pbVar5,(string *)local_88._M_local_buf);
      std::__cxx11::string::~string((string *)local_88._M_local_buf);
      std::__cxx11::string::~string((string *)&cge);
    }
  }
  AddDirectoryInstallRule(this,os,config,indent,&dirs);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dirs);
  return;
}

Assistant:

void cmInstallDirectoryGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::vector<std::string> dirs;
  cmGeneratorExpression ge;
  for (std::string const& d : this->Directories) {
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(d);
    cmSystemTools::ExpandListArgument(
      cge->Evaluate(this->LocalGenerator, config), dirs);
  }

  // Make sure all dirs have absolute paths.
  cmMakefile const& mf = *this->LocalGenerator->GetMakefile();
  for (std::string& d : dirs) {
    if (!cmSystemTools::FileIsFullPath(d)) {
      d = mf.GetCurrentSourceDirectory() + "/" + d;
    }
  }

  this->AddDirectoryInstallRule(os, config, indent, dirs);
}